

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void legendre_function_q_values(int *n_data,int *n,double *x,double *fx)

{
  int iVar1;
  uint uVar2;
  double local_68 [12];
  
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[6] = 0.5;
  local_68[7] = 0.5;
  local_68[8] = 0.5;
  local_68[9] = 0.5;
  local_68[10] = 0.5;
  local_68[0xb] = 0.5;
  uVar2 = *n_data;
  if ((int)uVar2 < 0) {
    *n_data = 0;
    uVar2 = 0;
  }
  else if (0xb < uVar2) {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
    return;
  }
  *n = (&DAT_00227d30)[uVar2];
  iVar1 = *n_data;
  *x = local_68[iVar1];
  *fx = *(double *)(&DAT_00227cd0 + (long)iVar1 * 8);
  *n_data = iVar1 + 1;
  return;
}

Assistant:

void legendre_function_q_values ( int *n_data, int *n, double *x, double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_FUNCTION_Q_VALUES returns values of the Legendre Q function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the order of the function.
//
//    Output, double *X, the point where the function is evaluated.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 12

  double fx_vec[N_MAX] = {
     0.00000000, -1.00000000,  0.00000000, 
     0.66666667, -0.40634921,  0.00000000, 
     0.54930614, -0.72534693, -0.81866327, 
    -0.19865477, -0.11616303,  0.29165814 };
  int n_vec[N_MAX] = {
     0,  1,  2, 
     3,  9, 10, 
     0,  1,  2, 
     3,  9, 10 };
  double x_vec[N_MAX] = {
    0.0,  0.0,  0.0, 
    0.0,  0.0,  0.0, 
    0.5,  0.5,  0.5, 
    0.5,  0.5,  0.5  };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *n = n_vec[*n_data];
    *x = x_vec[*n_data];
    *fx = fx_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}